

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

value * __thiscall mpt::value::operator=(value *this,span<const_double> *val)

{
  int iVar1;
  int t;
  span<const_double> *val_local;
  value *this_local;
  
  iVar1 = type_properties<mpt::span<const_double>_>::id(true);
  if (iVar1 < 1) {
    this->_addr = (void *)0x0;
    this->_type = 0;
  }
  else {
    this->_addr = val;
    this->_type = (long)iVar1;
  }
  return this;
}

Assistant:

inline value &value::operator=(const T &val)
{
	const int t = type_properties<T>::id(true);
	if (t <= 0) {
		_addr = 0;
		_type = 0;
	}
	else {
		_addr = &val;
		_type = t;
	}
	return *this;
}